

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatchkit.hpp
# Opt level: O3

bool chaiscript::detail::Dispatch_Engine::function_less_than
               (Proxy_Function *lhs,Proxy_Function *rhs)

{
  Type_Info *this;
  Type_Info *ti;
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  element_type *peVar3;
  pointer pTVar4;
  pointer pTVar5;
  pointer pTVar6;
  pointer pTVar7;
  bool bVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar14;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  
  peVar1 = (lhs->
           super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    lVar12 = 0;
  }
  else {
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    lVar9 = __dynamic_cast(peVar1,&chaiscript::dispatch::Proxy_Function_Base::typeinfo,
                           &chaiscript::dispatch::Dynamic_Proxy_Function::typeinfo,0);
    lVar12 = 0;
    if (lVar9 != 0) {
      this_00 = (lhs->
                super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
                )._M_refcount._M_pi;
      lVar12 = lVar9;
      if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      else if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
  }
  peVar1 = (rhs->
           super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    local_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    lVar9 = 0;
  }
  else {
    local_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    lVar10 = __dynamic_cast(peVar1,&chaiscript::dispatch::Proxy_Function_Base::typeinfo,
                            &chaiscript::dispatch::Dynamic_Proxy_Function::typeinfo,0);
    lVar9 = 0;
    if (lVar10 != 0) {
      local_50 = (rhs->
                 super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
                 )._M_refcount._M_pi;
      lVar9 = lVar10;
      if (local_50 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        local_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      else if (__libc_single_threaded == '\0') {
        LOCK();
        local_50->_M_use_count = local_50->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_50->_M_use_count = local_50->_M_use_count + 1;
      }
    }
  }
  if (lVar12 == 0) {
    if (lVar9 != 0) {
LAB_0018945f:
      bVar14 = true;
      goto LAB_001895ba;
    }
    peVar1 = (lhs->
             super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr;
    peVar3 = (rhs->
             super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr;
    pTVar4 = (peVar1->m_types).
             super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    pTVar5 = (peVar1->m_types).
             super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pTVar6 = (peVar3->m_types).
             super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    pTVar7 = (peVar3->m_types).
             super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (function_less_than(std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>const&,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>const&)
        ::boxed_type == '\0') {
      function_less_than();
    }
    uVar11 = ((long)pTVar4 - (long)pTVar5 >> 3) * -0x5555555555555555;
    uVar13 = ((long)pTVar6 - (long)pTVar7 >> 3) * -0x5555555555555555;
    if (function_less_than(std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>const&,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>const&)
        ::boxed_pod_type == '\0') {
      function_less_than();
    }
    if (uVar11 < uVar13) {
      uVar13 = uVar11;
    }
    if (1 < uVar13) {
      lVar9 = uVar13 - 1;
      lVar12 = 0x18;
      do {
        pTVar4 = (peVar1->m_types).
                 super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        this = (Type_Info *)((long)&pTVar4->m_type_info + lVar12);
        pTVar5 = (peVar3->m_types).
                 super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        ti = (Type_Info *)((long)&pTVar5->m_type_info + lVar12);
        bVar14 = Type_Info::bare_equal(this,ti);
        if ((!bVar14) ||
           ((*(byte *)((long)&pTVar4->m_flags + lVar12) & 1) !=
            (*(byte *)((long)&pTVar5->m_flags + lVar12) & 1))) {
          bVar14 = Type_Info::bare_equal(this,ti);
          if ((bVar14) &&
             (((*(byte *)((long)&pTVar4->m_flags + lVar12) & 1) != 0 &&
              ((*(byte *)((long)&pTVar5->m_flags + lVar12) & 1) == 0)))) goto LAB_001895b8;
          bVar14 = Type_Info::bare_equal(this,ti);
          if ((bVar14) && ((*(byte *)((long)&pTVar4->m_flags + lVar12) & 1) == 0))
          goto LAB_0018945f;
          bVar14 = Type_Info::bare_equal(this,&function_less_than::boxed_type);
          if (bVar14) goto LAB_001895b8;
          bVar14 = Type_Info::bare_equal(ti,&function_less_than::boxed_type);
          bVar8 = Type_Info::bare_equal(this,&function_less_than::boxed_pod_type);
          if ((!bVar14) && (!bVar8)) {
            bVar8 = Type_Info::bare_equal(ti,&function_less_than::boxed_pod_type);
            bVar14 = true;
            if (!bVar8) {
              bVar14 = this->m_type_info < ti->m_type_info;
            }
          }
          break;
        }
        lVar12 = lVar12 + 0x18;
        bVar14 = false;
        lVar9 = lVar9 + -1;
      } while (lVar9 != 0);
      goto LAB_001895ba;
    }
  }
  else if (lVar9 != 0) {
    lVar10 = *(long *)(lVar12 + 0x60);
    p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar12 + 0x68);
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      }
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
    if (lVar10 != 0) {
      lVar12 = *(long *)(lVar9 + 0x60);
      p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar9 + 0x68);
      if (p_Var2 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        bVar14 = lVar12 == 0;
      }
      else {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        }
        bVar14 = lVar12 == 0;
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      }
      goto LAB_001895ba;
    }
  }
LAB_001895b8:
  bVar14 = false;
LAB_001895ba:
  if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return bVar14;
}

Assistant:

static bool function_less_than(const Proxy_Function &lhs, const Proxy_Function &rhs)
        {

          auto dynamic_lhs(std::dynamic_pointer_cast<const dispatch::Dynamic_Proxy_Function>(lhs));
          auto dynamic_rhs(std::dynamic_pointer_cast<const dispatch::Dynamic_Proxy_Function>(rhs));

          if (dynamic_lhs && dynamic_rhs)
          {
            if (dynamic_lhs->get_guard())
            {
              return dynamic_rhs->get_guard() ? false : true;
            } else {
              return false;
            }
          }

          if (dynamic_lhs && !dynamic_rhs)
          {
            return false;
          }

          if (!dynamic_lhs && dynamic_rhs)
          {
            return true;
          }

          const auto &lhsparamtypes = lhs->get_param_types();
          const auto &rhsparamtypes = rhs->get_param_types();

          const auto lhssize = lhsparamtypes.size();
          const auto rhssize = rhsparamtypes.size();

#ifdef CHAISCRIPT_HAS_MAGIC_STATICS
          static auto boxed_type = user_type<Boxed_Value>();
          static auto boxed_pod_type = user_type<Boxed_Number>();
#else
          auto boxed_type = user_type<Boxed_Value>();
          auto boxed_pod_type = user_type<Boxed_Number>();
#endif

          for (size_t i = 1; i < lhssize && i < rhssize; ++i)
          {
            const Type_Info &lt = lhsparamtypes[i];
            const Type_Info &rt = rhsparamtypes[i];

            if (lt.bare_equal(rt) && lt.is_const() == rt.is_const())
            {
              continue; // The first two types are essentially the same, next iteration
            }

            // const is after non-const for the same type
            if (lt.bare_equal(rt) && lt.is_const() && !rt.is_const())
            {
              return false;
            }

            if (lt.bare_equal(rt) && !lt.is_const())
            {
              return true;
            }

            // boxed_values are sorted last
            if (lt.bare_equal(boxed_type))
            {
              return false;
            }

            if (rt.bare_equal(boxed_type))
            {
              if (lt.bare_equal(boxed_pod_type))
              {
                return true;
              }
              return true;
            }

            if (lt.bare_equal(boxed_pod_type))
            {
              return false;
            }

            if (rt.bare_equal(boxed_pod_type))
            {
              return true;
            }

            // otherwise, we want to sort by typeid
            return lt < rt;
          }

          return false;
        }